

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int secp256k1_is_zero_array(uchar *s,size_t len)

{
  void *in_RSI;
  long in_RDI;
  size_t i;
  int ret;
  uchar acc;
  size_t in_stack_ffffffffffffffd8;
  void *ptr;
  undefined1 local_11;
  
  local_11 = 0;
  for (ptr = (void *)0x0; ptr < in_RSI; ptr = (void *)((long)ptr + 1)) {
    local_11 = local_11 | *(byte *)(in_RDI + (long)ptr);
  }
  secp256k1_memclear(ptr,in_stack_ffffffffffffffd8);
  return (uint)(local_11 == 0);
}

Assistant:

static SECP256K1_INLINE int secp256k1_is_zero_array(const unsigned char *s, size_t len) {
    unsigned char acc = 0;
    int ret;
    size_t i;

    for (i = 0; i < len; i++) {
        acc |= s[i];
    }
    ret = (acc == 0);
    /* acc may contain secret values. Try to explicitly clear it. */
    secp256k1_memclear(&acc, sizeof(acc));
    return ret;
}